

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_uncomp_copy(aec_stream_conflict *strm)

{
  uint *puVar1;
  int *piVar2;
  uint32_t *puVar3;
  uint uVar4;
  internal_state_conflict *piVar5;
  internal_state_conflict *piVar6;
  byte *pbVar7;
  uint *puVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  internal_state_conflict *state;
  
  piVar5 = strm->state;
  while( true ) {
    uVar4 = strm->bits_per_sample;
    piVar6 = strm->state;
    iVar9 = piVar6->bitp;
    if (iVar9 < (int)uVar4) {
      sVar10 = strm->avail_in;
      do {
        sVar10 = sVar10 - 1;
        if (sVar10 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar10;
        uVar11 = piVar6->acc << 8;
        piVar6->acc = uVar11;
        pbVar7 = strm->next_in;
        strm->next_in = pbVar7 + 1;
        piVar6->acc = *pbVar7 | uVar11;
        iVar9 = iVar9 + 8;
        piVar6->bitp = iVar9;
      } while (iVar9 < (int)uVar4);
    }
    uVar11 = strm->avail_out;
    if (uVar11 < piVar6->bytes_per_sample) break;
    puVar8 = piVar6->rsip;
    puVar1 = puVar8 + 1;
    piVar6->rsip = puVar1;
    *puVar8 = (uint)(piVar6->acc >> ((char)piVar6->bitp - (char)uVar4 & 0x3fU)) &
              (uint)(0xffffffffffffffff >> (-(char)uVar4 & 0x3fU));
    strm->avail_out = uVar11 - piVar6->bytes_per_sample;
    if (piVar6->rsi_size == (long)puVar1 - (long)piVar6->rsi_buffer >> 2) {
      (*piVar6->flush_output)(strm);
      piVar6->flush_start = piVar6->rsi_buffer;
      piVar6->rsip = piVar6->rsi_buffer;
    }
    piVar2 = &strm->state->bitp;
    *piVar2 = *piVar2 - strm->bits_per_sample;
    puVar3 = &piVar5->i;
    *puVar3 = *puVar3 - 1;
    if (*puVar3 == 0) {
      piVar5->mode = m_id;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int m_uncomp_copy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (copysample(strm) == 0)
            return M_EXIT;
    } while(--state->i);

    state->mode = m_id;
    return M_CONTINUE;
}